

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::FindVCChannels
          (LWOImporter *this,Surface *surf,SortedRep *sorted,Layer *layer,uint *out)

{
  pointer pVVar1;
  uint uVar2;
  __type _Var3;
  const_reference cVar4;
  bool bVar5;
  uint uVar6;
  Logger *this_00;
  ulong uVar7;
  pointer pFVar8;
  ulong __n;
  uint uVar9;
  string *__rhs;
  ulong uVar10;
  uint *puVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar6 = 0;
  uVar9 = 0;
  do {
    uVar7 = (ulong)uVar9;
    pVVar1 = (layer->mVColorChannels).
             super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(layer->mVColorChannels).
                       super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x70) <= uVar7)
    {
      if (uVar6 != 8) {
        out[uVar6] = 0xffffffff;
      }
      return;
    }
    __rhs = &pVVar1[uVar7].super_VMapEntry.name;
    _Var3 = std::operator==(&surf->mVCMap,__rhs);
    if (_Var3) {
      uVar2 = 7;
      if (uVar6 < 7) {
        uVar2 = uVar6;
      }
      for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
        out[uVar7 + 1] = out[uVar7];
      }
      *out = uVar9;
      uVar6 = uVar6 + 1;
    }
    else {
      for (puVar11 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          puVar11 !=
          (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish; puVar11 = puVar11 + 1) {
        pFVar8 = (layer->mFaces).
                 super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                 super__Vector_impl_data._M_start + *puVar11;
        for (uVar10 = 0; uVar10 < (pFVar8->super_aiFace).mNumIndices; uVar10 = uVar10 + 1) {
          __n = (ulong)(pFVar8->super_aiFace).mIndices[uVar10];
          cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (&pVVar1[uVar7].super_VMapEntry.abAssigned,__n);
          if (cVar4) {
            local_78._M_dataplus._M_p = (char *)0x0;
            local_78._M_string_length = 0x3f80000000000000;
            bVar5 = aiColor4t<float>::operator!=
                              ((aiColor4t<float> *)
                               (__n * 0x10 +
                               *(long *)&pVVar1[uVar7].super_VMapEntry.rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data),(aiColor4t<float> *)&local_78);
            if (bVar5) {
              if (uVar6 < 8) {
                uVar10 = (ulong)uVar6;
                uVar6 = uVar6 + 1;
                out[uVar10] = uVar9;
              }
              else {
                this_00 = DefaultLogger::get();
                std::operator+(&local_50,
                               "LWO: Maximum number of vertex color channels for this mesh reached. Skipping channel \'"
                               ,__rhs);
                std::operator+(&local_78,&local_50,"\'");
                Logger::error(this_00,local_78._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&local_78);
                std::__cxx11::string::~string((string *)&local_50);
              }
              puVar11 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish + -1;
              break;
            }
          }
        }
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void LWOImporter::FindVCChannels(const LWO::Surface& surf, LWO::SortedRep& sorted, const LWO::Layer& layer,
    unsigned int out[AI_MAX_NUMBER_OF_COLOR_SETS])
{
    unsigned int next = 0;

    // Check whether we have an vc entry != 0 for one of the faces in 'sorted'
    for (unsigned int i = 0; i < layer.mVColorChannels.size();++i)  {
        const LWO::VColorChannel& vc = layer.mVColorChannels[i];

        if (surf.mVCMap == vc.name) {
            // The vertex color map is explicitly requested by the surface so we need to take special care of it
            for (unsigned int a = 0; a < std::min(next,AI_MAX_NUMBER_OF_COLOR_SETS-1u); ++a) {
                out[a+1] = out[a];
            }
            out[0] = i;
            ++next;
        }
        else {

            for (LWO::SortedRep::iterator it = sorted.begin(); it != sorted.end(); ++it)    {
                const LWO::Face& face = layer.mFaces[*it];

                for (unsigned int n = 0; n < face.mNumIndices; ++n) {
                    unsigned int idx = face.mIndices[n];

                    if (vc.abAssigned[idx] && ((aiColor4D*)&vc.rawData[0])[idx] != aiColor4D(0.0,0.0,0.0,1.0)) {
                        if (next >= AI_MAX_NUMBER_OF_COLOR_SETS) {

                            ASSIMP_LOG_ERROR("LWO: Maximum number of vertex color channels for "
                                "this mesh reached. Skipping channel \'" + vc.name + "\'");

                        }
                        else {
                            out[next++] = i;
                        }
                        it = sorted.end()-1;
                        break;
                    }
                }
            }
        }
    }
    if (next != AI_MAX_NUMBER_OF_COLOR_SETS) {
        out[next] = UINT_MAX;
    }
}